

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_2::FileState::Truncate(FileState *this)

{
  long lVar1;
  pointer ppcVar2;
  int iVar3;
  char **block;
  pointer ppcVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->blocks_mutex_);
  if (iVar3 == 0) {
    ppcVar2 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar4 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppcVar4 != ppcVar2; ppcVar4 = ppcVar4 + 1) {
      if (*ppcVar4 != (char *)0x0) {
        operator_delete__(*ppcVar4);
      }
    }
    ppcVar4 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar4) {
      (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar4;
    }
    this->size_ = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->blocks_mutex_);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar3);
  }
  __stack_chk_fail();
}

Assistant:

void Truncate() {
    MutexLock lock(&blocks_mutex_);
    for (char*& block : blocks_) {
      delete[] block;
    }
    blocks_.clear();
    size_ = 0;
  }